

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase<Impl1,Impl1>
          (vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *this,
          undefined8 param_2)

{
  ulong uVar1;
  size_t new_size;
  pair<unsigned_long,_unsigned_long> pVar2;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> v;
  
  uVar1 = (ulong)(*(long *)(this + 0x18) - *(long *)this) >> 4 & 0xfffffffffffffffe;
  new_size = uVar1 + (uVar1 == 0);
  pVar2 = vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
          calculate_storage_size
                    ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)
                     this,new_size,0x30,8);
  v._free_elem = (elem_ptr_pointer)0x0;
  v._begin_storage = (void_pointer)0x0;
  v.super_allocator_base<std::allocator<unsigned_char>_>._storage = (void_pointer)0x0;
  v.super_allocator_base<std::allocator<unsigned_char>_>._end_storage = (void_pointer)0x0;
  v._align_max = 8;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::init_layout
            (&v,pVar2.first,new_size,pVar2.second);
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
  push_back_new_elem_w_storage_increase_copy
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)this,&v);
  push_back_new_elem<Impl1,Impl1>
            ((vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *)&v,param_2)
  ;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::swap
            ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)this,&v);
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::~vector(&v);
  return;
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}